

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void mul(double *ret,double *mat,double *vec,int16_t row,int16_t col)

{
  short in_CX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  short in_R8W;
  int16_t idx;
  int16_t j;
  int16_t i;
  short local_20;
  short local_1e;
  
  if (in_RDI == in_RDX) {
    printf("%s pointer error !\n","mul");
    exit(-1);
  }
  for (local_1e = 0; local_1e < in_CX; local_1e = local_1e + 1) {
    *(undefined8 *)(in_RDI + (long)local_1e * 8) = 0;
  }
  for (local_20 = 0; local_20 < in_R8W; local_20 = local_20 + 1) {
    for (local_1e = 0; local_1e < in_CX; local_1e = local_1e + 1) {
      *(double *)(in_RDI + (long)local_1e * 8) =
           *(double *)(in_RSI + (long)(short)(in_CX * local_20 + local_1e) * 8) *
           *(double *)(in_RDX + (long)local_20 * 8) + *(double *)(in_RDI + (long)local_1e * 8);
    }
  }
  return;
}

Assistant:

inline void mul(double* ret, const double* mat, const double* vec, const int16_t row, const int16_t col) {
  int16_t i, j, idx;
#ifdef DEBUG_MODE
  if (ret == vec) {
    printf("%s pointer error !\n", __func__);
    exit(-1);
  }
#endif
  for (i = 0; i < row; i++) {
    ret[i] = 0.0;
  }

  for (j = 0; j < col; j++) {
    for (i = 0; i < row; i++) {
      idx = row * j + i;
      ret[i] += mat[idx] * vec[j];
    }
  }
}